

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttribute.cpp
# Opt level: O2

string * __thiscall
iDynTree::XMLAttribute::description_abi_cxx11_(string *__return_storage_ptr__,XMLAttribute *this)

{
  ostream *poVar1;
  ostringstream str;
  ostringstream aoStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  if ((this->m_prefix)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)aoStack_188,(string *)&this->m_prefix);
    std::operator<<(poVar1,":");
  }
  poVar1 = std::operator<<((ostream *)aoStack_188,(string *)this);
  poVar1 = std::operator<<(poVar1,"=");
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_value);
  std::operator<<(poVar1,"\"");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  return __return_storage_ptr__;
}

Assistant:

const std::string XMLAttribute::description() const
    {
        std::ostringstream str;
        if (!m_prefix.empty()) {
            str << m_prefix << ":";
        }
        str << m_name << "=" << "\"" << m_value <<"\"";
        return str.str();
    }